

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::Texture2DFormatCase::init(Texture2DFormatCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dataType;
  TestLog *pTVar1;
  int iVar2;
  ostream *stream;
  Texture2D *this_00;
  TextureFormatInfo spec;
  ostringstream fmtName;
  Enum<int,_2UL> local_398;
  long local_388 [2];
  TextureFormat local_378;
  LogGradientFmt local_370;
  TextureFormatInfo local_360;
  undefined1 local_320 [376];
  undefined1 local_1a8 [8];
  deUint32 local_1a0;
  ios_base local_130 [264];
  
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  if (this->m_dataType == 0) {
    local_378 = glu::mapGLInternalFormat(this->m_format);
  }
  else {
    local_378 = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  }
  tcu::getTextureFormatInfo(&local_360,&local_378);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  if (this->m_dataType == 0) {
    local_1a0 = this->m_format;
    local_1a8 = (undefined1  [8])glu::getTextureFormatName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_1a8,(ostream *)local_320);
  }
  else {
    local_1a0 = this->m_format;
    local_1a8 = (undefined1  [8])glu::getTextureFormatName;
    stream = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_1a8,(ostream *)local_320)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
    local_398.m_value = this->m_dataType;
    local_398.m_getName = glu::getTypeName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_398,stream);
  }
  local_1a8 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"2D texture, ",0xc);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,(char *)local_398.m_getName,
             CONCAT44(local_398._12_4_,local_398.m_value));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,", ",2);
  std::ostream::operator<<((ostringstream *)&local_1a0,this->m_width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"x",1);
  std::ostream::operator<<((ostringstream *)&local_1a0,this->m_height);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,",\n  fill with ",0xe);
  local_370.valueMin = &local_360.valueMin;
  local_370.valueMax = &local_360.valueMax;
  glu::TextureTestUtil::operator<<((ostream *)&local_1a0,&local_370);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," gradient",9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_398.m_getName != (GetNameFunc)local_388) {
    operator_delete(local_398.m_getName,local_388[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  dataType = this->m_dataType;
  if (dataType == 0) {
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D(this_00,this->m_renderCtx,this->m_format,this->m_width,this->m_height)
    ;
  }
  else {
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_00,this->m_renderCtx,this->m_format,dataType,this->m_width,this->m_height);
  }
  this->m_texture = this_00;
  tcu::Texture2D::allocLevel(&this_00->m_refTexture,0);
  tcu::fillWithComponentGradients
            ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_360.valueMin,&local_360.valueMax);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  iVar2 = std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  return iVar2;
}

Assistant:

void Texture2DFormatCase::init (void)
{
	TestLog&				log		= m_testCtx.getLog();
	tcu::TextureFormat		fmt		= m_dataType ? glu::mapGLTransferFormat(m_format, m_dataType) : glu::mapGLInternalFormat(m_format);
	tcu::TextureFormatInfo	spec	= tcu::getTextureFormatInfo(fmt);
	std::ostringstream		fmtName;

	if (m_dataType)
		fmtName << glu::getTextureFormatStr(m_format) << ", " << glu::getTypeStr(m_dataType);
	else
		fmtName << glu::getTextureFormatStr(m_format);

	log << TestLog::Message << "2D texture, " << fmtName.str() << ", " << m_width << "x" << m_height
							<< ",\n  fill with " << formatGradient(&spec.valueMin, &spec.valueMax) << " gradient"
		<< TestLog::EndMessage;

	m_texture = m_dataType != GL_NONE
			  ? new glu::Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height)	// Implicit internal format.
			  : new glu::Texture2D(m_renderCtx, m_format, m_width, m_height);				// Explicit internal format.

	// Fill level 0.
	m_texture->getRefTexture().allocLevel(0);
	tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(0), spec.valueMin, spec.valueMax);
}